

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.h
# Opt level: O0

void __thiscall
Js::FunctionCodeGenJitTimeData::SetGlobalObjTypeSpecFldInfo
          (FunctionCodeGenJitTimeData *this,uint propertyInfoId,ObjTypeSpecFldInfo *info)

{
  code *pcVar1;
  bool bVar2;
  WriteBarrierPtr<ObjTypeSpecFldInfo> **ppWVar3;
  undefined4 *puVar4;
  ObjTypeSpecFldInfo *info_local;
  uint propertyInfoId_local;
  FunctionCodeGenJitTimeData *this_local;
  
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->globalObjTypeSpecFldInfoArray);
  if ((*ppWVar3 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) ||
     (this->globalObjTypeSpecFldInfoCount <= propertyInfoId)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.h"
                                ,0x99,
                                "(this->globalObjTypeSpecFldInfoArray != nullptr && propertyInfoId < this->globalObjTypeSpecFldInfoCount)"
                                ,
                                "this->globalObjTypeSpecFldInfoArray != nullptr && propertyInfoId < this->globalObjTypeSpecFldInfoCount"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->globalObjTypeSpecFldInfoArray);
  Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::operator=(*ppWVar3 + propertyInfoId,info);
  return;
}

Assistant:

void SetGlobalObjTypeSpecFldInfo(uint propertyInfoId, ObjTypeSpecFldInfo* info) const
        {
            Assert(this->globalObjTypeSpecFldInfoArray != nullptr && propertyInfoId < this->globalObjTypeSpecFldInfoCount);
            this->globalObjTypeSpecFldInfoArray[propertyInfoId] = info;
        }